

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::HttpInputStreamImpl
          (HttpInputStreamImpl *this,AsyncInputStream *inner,Array<char> *headerBufferParam,
          ArrayPtr<char> leftoverParam,OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method,
          StringPtr url,HttpHeaders *headers)

{
  SourceLocation location;
  bool bVar1;
  Array<char> *other;
  char *pcVar2;
  char *pcVar3;
  HttpHeaders *pHVar4;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar5;
  char *pcVar6;
  StringPtr url_00;
  undefined8 in_stack_fffffffffffffe20;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *this_00;
  bool local_1ba;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_158;
  SourceLocation local_140;
  undefined1 local_128 [8];
  PromiseFulfillerPair<void> paf;
  Fault f_1;
  char *local_100;
  undefined1 local_f8 [8];
  DebugComparison<char_&,_char> _kjCondition_1;
  Fault f;
  unsigned_long *local_c0;
  DebugComparison<unsigned_long_&,_int> local_b8;
  bool local_89;
  char *pcStack_88;
  bool _kjCondition;
  size_t sStack_80;
  undefined1 local_78 [64];
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *local_38;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method_local;
  Array<char> *headerBufferParam_local;
  AsyncInputStream *inner_local;
  HttpInputStreamImpl *this_local;
  ArrayPtr<char> leftoverParam_local;
  
  pcVar6 = (char *)leftoverParam.size_;
  this_local = (HttpInputStreamImpl *)leftoverParam.ptr;
  local_38 = method;
  method_local = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)headerBufferParam;
  headerBufferParam_local = (Array<char> *)inner;
  inner_local = (AsyncInputStream *)this;
  leftoverParam_local.ptr = pcVar6;
  HttpInputStream::HttpInputStream(&this->super_HttpInputStream);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>);
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_readRequest_00d943b8;
  this->inner = (AsyncInputStream *)headerBufferParam_local;
  other = mv<kj::Array<char>>(headerBufferParam);
  Array<char>::Array(&this->headerBuffer,other);
  pcVar2 = ArrayPtr<char>::begin((ArrayPtr<char> *)&this_local);
  pcVar3 = Array<char>::begin(&this->headerBuffer);
  this->messageHeaderEnd = (long)pcVar2 - (long)pcVar3;
  (this->leftover).ptr = (char *)this_local;
  (this->leftover).size_ = (size_t)leftoverParam_local.ptr;
  pHVar4 = mv<kj::HttpHeaders>(headers);
  HttpHeaders::HttpHeaders(&this->headers,pHVar4);
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::OneOf
            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)local_78,method);
  pcStack_88 = url.content.ptr;
  sStack_80 = url.content.size_;
  url_00.content.size_ = (size_t)pcVar6;
  url_00.content.ptr = (char *)url.content.size_;
  getResumingRequest((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest> *)
                     (local_78 + 0x10),(HttpInputStreamImpl *)local_78,
                     (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)url.content.ptr,url_00);
  Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_>::Maybe
            (&this->resumingRequest,
             (OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest> *)(local_78 + 0x10));
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>::~OneOf
            ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest> *)(local_78 + 0x10));
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf
            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)local_78);
  this->lineBreakBeforeNextHeader = false;
  this->broken = false;
  this->pendingMessageCount = 0;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&this->onMessageDone);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&this->messageReadQueue);
  local_c0 = (unsigned_long *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->messageHeaderEnd);
  f.exception._4_4_ = 2;
  kj::_::DebugExpression<unsigned_long&>::operator>=
            (&local_b8,(DebugExpression<unsigned_long&> *)&local_c0,(int *)((long)&f.exception + 4))
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_b8);
  local_1ba = false;
  if (bVar1) {
    pcVar2 = ArrayPtr<char>::end(&this->leftover);
    pcVar3 = Array<char>::end(&this->headerBuffer);
    local_1ba = pcVar2 <= pcVar3;
  }
  local_89 = local_1ba;
  if (local_1ba == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[66]>
              ((Fault *)&_kjCondition_1.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x566,FAILED,"messageHeaderEnd >= 2 && leftover.end() <= headerBuffer.end()",
               "_kjCondition,\"invalid SuspendedRequest - leftover buffer not where it should be\"",
               &local_89,
               (char (*) [66])"invalid SuspendedRequest - leftover buffer not where it should be");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
  }
  pcVar2 = ArrayPtr<char>::begin(&this->leftover);
  local_100 = (char *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pcVar2 + -1);
  f_1.exception._7_1_ = 10;
  kj::_::DebugExpression<char&>::operator==
            ((DebugComparison<char_&,_char> *)local_f8,(DebugExpression<char&> *)&local_100,
             (char *)((long)&f_1.exception + 7));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (bVar1) {
    pcVar2 = ArrayPtr<char>::begin(&this->leftover);
    this->messageHeaderEnd = this->messageHeaderEnd - (ulong)((pcVar2[-2] == '\r') + 1);
    this->pendingMessageCount = this->pendingMessageCount + 1;
    SourceLocation::SourceLocation
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"HttpInputStreamImpl",0x56f,0x10);
    location.function = (char *)local_140._16_8_;
    location.fileName = local_140.function;
    location.lineNumber = (int)in_stack_fffffffffffffe20;
    location.columnNumber = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
    newPromiseAndFulfiller<void>(location);
    t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                  ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
    this_00 = &local_158;
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(this_00,t);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              (&this->onMessageDone,this_00);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_158);
    pPVar5 = mv<kj::Promise<void>>((Promise<void> *)local_128);
    Promise<void>::operator=(&this->messageReadQueue,pPVar5);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_128);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&,char_const(&)[38]>
            ((Fault *)&paf.fulfiller.ptr,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x567,FAILED,"leftover.begin()[-1] == \'\\n\'",
             "_kjCondition,\"invalid SuspendedRequest - missing LF\"",
             (DebugComparison<char_&,_char> *)local_f8,
             (char (*) [38])"invalid SuspendedRequest - missing LF");
  kj::_::Debug::Fault::fatal((Fault *)&paf.fulfiller.ptr);
}

Assistant:

explicit HttpInputStreamImpl(AsyncInputStream& inner,
      kj::Array<char> headerBufferParam,
      kj::ArrayPtr<char> leftoverParam,
      kj::OneOf<HttpMethod, HttpConnectMethod> method,
      kj::StringPtr url,
      HttpHeaders headers)
      : inner(inner),
        headerBuffer(kj::mv(headerBufferParam)),
        // Initialize `messageHeaderEnd` to a safe value, we'll adjust it below.
        messageHeaderEnd(leftoverParam.begin() - headerBuffer.begin()),
        leftover(leftoverParam),
        headers(kj::mv(headers)),
        resumingRequest(getResumingRequest(method, url)) {
    // Constructor used for resuming a SuspendedRequest.

    // We expect headerBuffer to look like this:
    //   <method> <url> <headers> [CR] LF <leftover>
    // We initialized `messageHeaderEnd` to the beginning of `leftover`, but we want to point it at
    // the CR (or LF if there's no CR).
    KJ_REQUIRE(messageHeaderEnd >= 2 && leftover.end() <= headerBuffer.end(),
        "invalid SuspendedRequest - leftover buffer not where it should be");
    KJ_REQUIRE(leftover.begin()[-1] == '\n', "invalid SuspendedRequest - missing LF");
    messageHeaderEnd -= 1 + (leftover.begin()[-2] == '\r');

    // We're in the middle of a message, so set up our state as such. Note that the only way to
    // resume a SuspendedRequest is via an HttpServer, but HttpServers never call
    // `awaitNextMessage()` before fully reading request bodies, meaning we expect that
    // `messageReadQueue` will never be used.
    ++pendingMessageCount;
    auto paf = kj::newPromiseAndFulfiller<void>();
    onMessageDone = kj::mv(paf.fulfiller);
    messageReadQueue = kj::mv(paf.promise);
  }